

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

int __thiscall Kvm::repl(Kvm *this,istream *in,ostream *out)

{
  Value *pVVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *__buf;
  char *__s;
  
  __s = "Fatal error -- READ!";
  do {
    std::operator<<(out,"kat> ");
    pVVar1 = (Value *)read(this,(int)in,__buf,in_RCX);
    if (pVVar1 == (Value *)0x0) {
LAB_0010d27a:
      puts(__s);
      poVar2 = std::operator<<(out,"Goodbye");
      std::endl<char,std::char_traits<char>>(poVar2);
      return 0;
    }
    pVVar1 = eval(this,pVVar1,this->GLOBAL_ENV);
    if (pVVar1 == (Value *)0x0) {
      __s = "Fatal error -- EVAL!";
      goto LAB_0010d27a;
    }
    print(this,pVVar1,out);
    std::endl<char,std::char_traits<char>>(out);
  } while( true );
}

Assistant:

int Kvm::repl(std::istream &in, std::ostream &out)
{
    while (true)
    {
        try
        {
            out << "kat> ";
            auto v = read(in);
            if (!v)
            {
                printf("Fatal error -- READ!\n");
                break;
            }
            auto r = eval(v, GLOBAL_ENV);
            if (!r)
            {
                printf("Fatal error -- EVAL!\n");
                break;
            }
            print(r, out);
            out << endl;
        } catch (KatException &e)
        {
            out << e.what() << endl;
            in.ignore(std::numeric_limits<std::streamsize>::max(), '\n');
        }
    }
    out << "Goodbye" << endl;
    return 0;
}